

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::(anonymous_namespace)::OneofFieldsArrayName_abi_cxx11_
                   (GeneratorOptions *options,Descriptor *desc)

{
  bool bVar1;
  string *in_RDI;
  Descriptor *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  allocator *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator local_4d [20];
  byte local_39;
  string local_38 [8];
  Descriptor *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  
  bVar1 = anon_unknown_0::HasOneofFields(in_stack_ffffffffffffff88);
  local_39 = 0;
  if (bVar1) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
    GetMessagePath_abi_cxx11_
              ((GeneratorOptions *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    local_39 = 1;
    std::operator+(__lhs,in_stack_ffffffffffffff90);
  }
  else {
    paVar2 = local_4d;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"null",paVar2);
    std::allocator<char>::~allocator((allocator<char> *)local_4d);
  }
  if ((local_39 & 1) != 0) {
    std::__cxx11::string::~string(local_38);
  }
  return in_RDI;
}

Assistant:

std::string OneofFieldsArrayName(const GeneratorOptions& options,
                                 const Descriptor* desc) {
  return HasOneofFields(desc)
             ? (GetMessagePath(options, desc) + kOneofGroupArrayName)
             : "null";
}